

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap_unittest.cc
# Opt level: O0

void __thiscall AddressMapUnittest_Basic_Test::TestBody(AddressMapUnittest_Basic_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  size_t sVar3;
  iterator __first;
  reference pvVar4;
  pair<int,_unsigned_long> *ppVar5;
  char *pcVar6;
  pointer pcVar7;
  char *in_R9;
  pair<int,_unsigned_long> pVar8;
  pair<void_*,_int> pVar9;
  pair<int,_unsigned_long> value;
  pair<int,_unsigned_long> value_00;
  pair<int,_unsigned_long> value_01;
  pair<int,_unsigned_long> value_02;
  AssertHelper local_1b28;
  Message local_1b20;
  int local_1b14;
  size_type local_1b10;
  undefined1 local_1b08 [8];
  AssertionResult gtest_ar_14;
  Message local_1af0;
  int local_1ae4;
  undefined1 local_1ae0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_1ab0;
  Message local_1aa8;
  undefined1 local_1aa0 [8];
  AssertionResult gtest_ar__12;
  int local_1a7c;
  pair<void_*,_int> local_1a78;
  pair<const_void_*,_int> local_1a68;
  pointer local_1a58;
  void *p_4;
  int i_5;
  Message local_1a40;
  size_type local_1a38;
  undefined1 local_1a30 [8];
  AssertionResult gtest_ar_12;
  FunctionRef<void_(const_void_*,_std::pair<int,_unsigned_long>_*)> local_1a18;
  undefined1 local_1a08 [8];
  set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  check_set;
  Message local_19d0;
  int local_19c4;
  undefined1 local_19c0 [8];
  AssertionResult gtest_ar_11;
  Message local_19a8;
  undefined1 local_19a0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_1970;
  Message local_1968;
  undefined1 local_1960 [8];
  AssertionResult gtest_ar__11;
  Message local_1948;
  int local_193c;
  undefined1 local_1938 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_1908;
  Message local_1900;
  undefined1 local_18f8 [8];
  AssertionResult gtest_ar__10;
  string local_18d0;
  AssertHelper local_18b0;
  Message local_18a8;
  bool local_1899;
  undefined1 local_1898 [8];
  AssertionResult gtest_ar__9;
  pointer pcStack_1880;
  int offs_2;
  char *p_3;
  int i_4;
  Message local_1868;
  int local_185c;
  undefined1 local_1858 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_1828;
  Message local_1820;
  undefined1 local_1818 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_17f0;
  Message local_17e8;
  int local_17dc;
  undefined1 local_17d8 [8];
  AssertionResult gtest_ar_7;
  Message local_17c0;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_1788;
  Message local_1780;
  undefined1 local_1778 [8];
  AssertionResult gtest_ar__7;
  int offs_1;
  Message local_1758;
  int local_174c;
  undefined1 local_1748 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_1718;
  Message local_1710;
  undefined1 local_1708 [8];
  AssertionResult gtest_ar__6;
  char *p_2;
  int i_3;
  Message local_16e0;
  int local_16d4;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_16a0;
  Message local_1698;
  bool local_1689;
  undefined1 local_1688 [8];
  AssertionResult gtest_ar__5;
  ValueT removed;
  void *p_1;
  int i_2;
  Message local_1650;
  int local_1644;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1610;
  Message local_1608;
  undefined1 local_1600 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_15d8;
  Message local_15d0;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar_2;
  Message local_15b0;
  undefined1 local_15a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1578;
  Message local_1570;
  undefined1 local_1568 [8];
  AssertionResult gtest_ar__3;
  Message local_1550;
  undefined1 local_1548 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1518;
  Message local_1510;
  undefined1 local_1508 [8];
  AssertionResult gtest_ar__2;
  string local_14e8;
  AssertHelper local_14c8;
  Message local_14c0;
  bool local_14b1;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar__1;
  int offs;
  AssertHelper local_1478;
  Message local_1470;
  bool local_1461;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar_;
  char *p;
  int i_1;
  void *res_p;
  ValueT *result;
  AddressMap<std::pair<int,_unsigned_long>_> map;
  uint local_13f4;
  char *pcStack_13f0;
  int x;
  ulong local_13e8;
  size_t s;
  int i;
  undefined1 local_13d0 [8];
  vector<PtrAndSize,_std::allocator<PtrAndSize>_> ptrs_and_sizes;
  anon_class_8_1_ba1d750b uniform;
  mt19937 rng;
  size_t kMaxSize;
  int kMaxRealSize;
  int kIters;
  int N;
  AddressMapUnittest_Basic_Test *this_local;
  
  kMaxRealSize = 100000;
  _kIters = this;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&uniform,0);
  ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&uniform;
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::vector
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0);
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::reserve
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,100000);
  for (s._0_4_ = 0; (int)s < 100000; s._0_4_ = (int)s + 1) {
    sVar3 = TestBody::anon_class_8_1_ba1d750b::operator()
                      ((anon_class_8_1_ba1d750b *)
                       &ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,0x30);
    local_13e8 = sVar3 + 1;
    pcStack_13f0 = (char *)operator_new__(local_13e8);
    std::vector<PtrAndSize,std::allocator<PtrAndSize>>::emplace_back<char*,unsigned_long&>
              ((vector<PtrAndSize,std::allocator<PtrAndSize>> *)local_13d0,&stack0xffffffffffffec10,
               &local_13e8);
  }
  for (local_13f4 = 0; (int)local_13f4 < 0x14; local_13f4 = local_13f4 + 1) {
    printf("Iteration %d/%d...\n",(ulong)local_13f4,0x14);
    __first = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::begin
                        ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0);
    map.allocated_ =
         (Object *)
         std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::end
                   ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0);
    std::
    shuffle<__gnu_cxx::__normal_iterator<PtrAndSize*,std::vector<PtrAndSize,std::allocator<PtrAndSize>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
                )__first._M_current,
               (__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
                )map.allocated_,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&uniform);
    AddressMap<std::pair<int,_unsigned_long>_>::AddressMap
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,malloc,free);
    for (p._4_4_ = 0; p._4_4_ < 100000; p._4_4_ = p._4_4_ + 1) {
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p._4_4_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::unique_ptr<char,_std::default_delete<char>_>::get(&pvVar4->ptr);
      ppVar5 = AddressMap<std::pair<int,_unsigned_long>_>::Find
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                          (Key)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
      local_1461 = ppVar5 == (pair<int,_unsigned_long> *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1460,&local_1461,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
      if (!bVar2) {
        testing::Message::Message(&local_1470);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&offs,(internal *)local_1460,(AssertionResult *)0x1670ae,"true","false"
                   ,in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1478,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x5d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1478,&local_1470);
        testing::internal::AssertHelper::~AssertHelper(&local_1478);
        std::__cxx11::string::~string((string *)&offs);
        testing::Message::~Message(&local_1470);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p._4_4_);
      sVar3 = TestBody::anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         &ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4->size);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = (int)sVar3;
      ppVar5 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,SizeFunc,0x6400000,
                          (Key)((long)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl +
                               (long)(int)gtest_ar__1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl),(Key *)&stack0xffffffffffffebc0);
      local_14b1 = ppVar5 == (pair<int,_unsigned_long> *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_14b0,&local_14b1,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
      if (!bVar2) {
        testing::Message::Message(&local_14c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_14e8,(internal *)local_14b0,(AssertionResult *)0x16714f,"true","false",
                   in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_14c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x5f,pcVar6);
        testing::internal::AssertHelper::operator=(&local_14c8,&local_14c0);
        testing::internal::AssertHelper::~AssertHelper(&local_14c8);
        std::__cxx11::string::~string((string *)&local_14e8);
        testing::Message::~Message(&local_14c0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
      uVar1 = gtest_ar_.message_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p._4_4_);
      pVar8 = std::make_pair<int&,unsigned_long&>((int *)((long)&p + 4),&pvVar4->size);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = pVar8.first;
      value._4_4_ = 0;
      value.first = (uint)gtest_ar__2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
      value.second = pVar8.second;
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                 (Key)uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,value);
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                         (Key)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1508,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1508);
      if (!bVar2) {
        testing::Message::Message(&local_1510);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_1508,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1518,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x61,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1518,&local_1510);
        testing::internal::AssertHelper::~AssertHelper(&local_1518);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_1510);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1508);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1548,"result->first","i",(int *)res_p,(int *)((long)&p + 4));
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1548);
      if (!bVar2) {
        testing::Message::Message(&local_1550);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1548);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x62,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__3.message_,&local_1550);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_1550);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1548);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,SizeFunc,0x31,
                         (Key)((long)gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl +
                              (long)(int)gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl),(Key *)&stack0xffffffffffffebc0);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1568,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1568);
      if (!bVar2) {
        testing::Message::Message(&local_1570);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_1568,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1578,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,99,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1578,&local_1570);
        testing::internal::AssertHelper::~AssertHelper(&local_1578);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_1570);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1568);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      testing::internal::EqHelper::Compare<const_void_*,_char_*,_nullptr>
                ((EqHelper *)local_15a8,"res_p","p",(void **)&stack0xffffffffffffebc0,
                 (char **)&gtest_ar_.message_);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15a8);
      if (!bVar2) {
        testing::Message::Message(&local_15b0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_15a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,100,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_15b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_15b0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_15a8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_15c8,"result->first","i",(int *)res_p,(int *)((long)&p + 4));
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8);
      if (!bVar2) {
        testing::Message::Message(&local_15d0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_15c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_15d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x65,pcVar6);
        testing::internal::AssertHelper::operator=(&local_15d8,&local_15d0);
        testing::internal::AssertHelper::~AssertHelper(&local_15d8);
        testing::Message::~Message(&local_15d0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
      uVar1 = gtest_ar_.message_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = p._4_4_ + 100000;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p._4_4_);
      pVar8 = std::make_pair<int,unsigned_long&>
                        ((int *)((long)&gtest_ar__4.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),&pvVar4->size);
      value_00._4_4_ = 0;
      value_00.first = pVar8.first;
      value_00.second = pVar8.second;
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                 (Key)uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,value_00);
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                         (Key)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1600,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1600);
      if (!bVar2) {
        testing::Message::Message(&local_1608);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_3.message_,(internal *)local_1600,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1610,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x67,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1610,&local_1608);
        testing::internal::AssertHelper::~AssertHelper(&local_1610);
        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1608);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1600);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_1644 = p._4_4_ + 100000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1640,"result->first","i + N",(int *)res_p,&local_1644);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1640);
      if (!bVar2) {
        testing::Message::Message(&local_1650);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1640);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffe9a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x68,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffe9a8,&local_1650);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe9a8);
        testing::Message::~Message(&local_1650);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
    }
    for (p_1._4_4_ = 0; p_1._4_4_ < 100000; p_1._4_4_ = p_1._4_4_ + 2) {
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_1._4_4_);
      pcVar7 = std::unique_ptr<char,_std::default_delete<char>_>::get(&pvVar4->ptr);
      std::pair<int,_unsigned_long>::pair<int,_unsigned_long,_true>
                ((pair<int,_unsigned_long> *)&gtest_ar__5.message_);
      local_1689 = AddressMap<std::pair<int,_unsigned_long>_>::FindAndRemove
                             ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,pcVar7,
                              (pair<int,_unsigned_long> *)&gtest_ar__5.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1688,&local_1689,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1688);
      if (!bVar2) {
        testing::Message::Message(&local_1698);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_4.message_,(internal *)local_1688,
                   (AssertionResult *)"map.FindAndRemove(p, &removed)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_16a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x6f,pcVar6);
        testing::internal::AssertHelper::operator=(&local_16a0,&local_1698);
        testing::internal::AssertHelper::~AssertHelper(&local_16a0);
        std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_1698);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1688);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_16d4 = p_1._4_4_ + 100000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_16d0,"removed.first","i + N",(int *)&gtest_ar__5.message_,
                 &local_16d4);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
      if (!bVar2) {
        testing::Message::Message(&local_16e0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffe918,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x70,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffe918,&local_16e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe918);
        testing::Message::~Message(&local_16e0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
    }
    for (p_2._4_4_ = 1; p_2._4_4_ < 100000; p_2._4_4_ = p_2._4_4_ + 2) {
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_2._4_4_);
      gtest_ar__6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::unique_ptr<char,_std::default_delete<char>_>::get(&pvVar4->ptr);
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                         (Key)gtest_ar__6.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1708,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1708);
      if (!bVar2) {
        testing::Message::Message(&local_1710);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_5.message_,(internal *)local_1708,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1718,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x76,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1718,&local_1710);
        testing::internal::AssertHelper::~AssertHelper(&local_1718);
        std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_1710);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1708);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_174c = p_2._4_4_ + 100000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1748,"result->first","i + N",(int *)res_p,&local_174c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1748);
      if (!bVar2) {
        testing::Message::Message(&local_1758);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1748);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffe8a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x77,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffe8a0,&local_1758);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe8a0);
        testing::Message::~Message(&local_1758);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1748);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_2._4_4_);
      sVar3 = TestBody::anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         &ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4->size);
      gtest_ar__7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (int)sVar3;
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,SizeFunc,0x31,
                         (Key)((long)gtest_ar__6.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl +
                              (long)gtest_ar__7.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_),(Key *)&stack0xffffffffffffebc0);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1778,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1778);
      if (!bVar2) {
        testing::Message::Message(&local_1780);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_6.message_,(internal *)local_1778,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1788,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x79,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1788,&local_1780);
        testing::internal::AssertHelper::~AssertHelper(&local_1788);
        std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_1780);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1778);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      testing::internal::EqHelper::Compare<const_void_*,_char_*,_nullptr>
                ((EqHelper *)local_17b8,"res_p","p",(void **)&stack0xffffffffffffebc0,
                 (char **)&gtest_ar__6.message_);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
      if (!bVar2) {
        testing::Message::Message(&local_17c0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_17b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7a,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_17c0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_17c0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_17dc = p_2._4_4_ + 100000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_17d8,"result->first","i + N",(int *)res_p,&local_17dc);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17d8);
      if (!bVar2) {
        testing::Message::Message(&local_17e8);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_17d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_17f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_17f0,&local_17e8);
        testing::internal::AssertHelper::~AssertHelper(&local_17f0);
        testing::Message::~Message(&local_17e8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_17d8);
      uVar1 = gtest_ar__6.message_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      gtest_ar__8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = p_2._4_4_ + 200000;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_2._4_4_);
      pVar8 = std::make_pair<int,unsigned_long&>
                        ((int *)((long)&gtest_ar__8.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),&pvVar4->size);
      value_01._4_4_ = 0;
      value_01.first = pVar8.first;
      value_01.second = pVar8.second;
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                 (Key)uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,value_01);
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,
                         (Key)gtest_ar__6.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1818,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1818);
      if (!bVar2) {
        testing::Message::Message(&local_1820);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_8.message_,(internal *)local_1818,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1828,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1828,&local_1820);
        testing::internal::AssertHelper::~AssertHelper(&local_1828);
        std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_1820);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1818);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_185c = p_2._4_4_ + 200000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1858,"result->first","i + 2*N",(int *)res_p,&local_185c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1858);
      if (!bVar2) {
        testing::Message::Message(&local_1868);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1858);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffe790,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7e,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffe790,&local_1868);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe790);
        testing::Message::~Message(&local_1868);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1858);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
    }
    for (p_3._4_4_ = 0; p_3._4_4_ < 100000; p_3._4_4_ = p_3._4_4_ + 2) {
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_3._4_4_);
      pcStack_1880 = std::unique_ptr<char,_std::default_delete<char>_>::get(&pvVar4->ptr);
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_3._4_4_);
      sVar3 = TestBody::anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)
                         &ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4->size);
      gtest_ar__9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (int)sVar3;
      ppVar5 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,SizeFunc,0x6400000,
                          pcStack_1880 +
                          gtest_ar__9.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_,(Key *)&stack0xffffffffffffebc0);
      local_1899 = ppVar5 == (pair<int,_unsigned_long> *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1898,&local_1899,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1898);
      if (!bVar2) {
        testing::Message::Message(&local_18a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_18d0,(internal *)local_1898,
                   (AssertionResult *)"!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p)",
                   "false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_18b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x85,pcVar6);
        testing::internal::AssertHelper::operator=(&local_18b0,&local_18a8);
        testing::internal::AssertHelper::~AssertHelper(&local_18b0);
        std::__cxx11::string::~string((string *)&local_18d0);
        testing::Message::~Message(&local_18a8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1898);
      pcVar7 = pcStack_1880;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = p_3._4_4_ + 200000;
      pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                         ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                          (long)p_3._4_4_);
      pVar8 = std::make_pair<int,unsigned_long&>
                        ((int *)((long)&gtest_ar__10.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),&pvVar4->size);
      value_02._4_4_ = 0;
      value_02.first = pVar8.first;
      value_02.second = pVar8.second;
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,pcVar7,value_02);
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,pcStack_1880);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_18f8,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f8);
      if (!bVar2) {
        testing::Message::Message(&local_1900);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_9.message_,(internal *)local_18f8,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1908,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x87,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1908,&local_1900);
        testing::internal::AssertHelper::~AssertHelper(&local_1908);
        std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_1900);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_18f8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_193c = p_3._4_4_ + 200000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1938,"result->first","i + 2*N",(int *)res_p,&local_193c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1938);
      if (!bVar2) {
        testing::Message::Message(&local_1948);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1938);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__11.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x88,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__11.message_,&local_1948);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
        testing::Message::~Message(&local_1948);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1938);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      res_p = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                        ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,SizeFunc,0x31,
                         pcStack_1880 +
                         gtest_ar__9.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,(Key *)&stack0xffffffffffffebc0);
      testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                ((AssertionResult *)local_1960,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1960);
      if (!bVar2) {
        testing::Message::Message(&local_1968);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_10.message_,(internal *)local_1960,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1970,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x89,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1970,&local_1968);
        testing::internal::AssertHelper::~AssertHelper(&local_1970);
        std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_1968);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1960);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      testing::internal::EqHelper::Compare<const_void_*,_char_*,_nullptr>
                ((EqHelper *)local_19a0,"res_p","p",(void **)&stack0xffffffffffffebc0,
                 &stack0xffffffffffffe780);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19a0);
      if (!bVar2) {
        testing::Message::Message(&local_19a8);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_19a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x8a,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_11.message_,&local_19a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_19a8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_19a0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
      local_19c4 = p_3._4_4_ + 200000;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_19c0,"result->first","i + 2*N",(int *)res_p,&local_19c4);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c0);
      if (!bVar2) {
        testing::Message::Message(&local_19d0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_19c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x8b,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_19d0);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)&check_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        testing::Message::~Message(&local_19d0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_0010de80;
    }
    std::
    set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
    ::set((set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
           *)local_1a08);
    gtest_ar_12.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_1a08;
    tcmalloc::FunctionRef<void(void_const*,std::pair<int,unsigned_long>*)>::
    FunctionRef<AddressMapUnittest_Basic_Test::TestBody()::__0,void>
              ((FunctionRef<void(void_const*,std::pair<int,unsigned_long>*)> *)&local_1a18,
               (anon_class_8_1_2d5f934b *)&gtest_ar_12.message_);
    AddressMap<std::pair<int,_unsigned_long>_>::Iterate
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,local_1a18);
    local_1a38 = std::
                 set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                 ::size((set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                         *)local_1a08);
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_1a30,"check_set.size()","N",&local_1a38,&kMaxRealSize);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a30);
    if (!bVar2) {
      testing::Message::Message(&local_1a40);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1a30);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffe5b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x93,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffe5b8,&local_1a40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe5b8);
      testing::Message::~Message(&local_1a40);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a30);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      for (p_4._4_4_ = 0; p_4._4_4_ < 100000; p_4._4_4_ = p_4._4_4_ + 1) {
        pvVar4 = std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::operator[]
                           ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0,
                            (long)p_4._4_4_);
        local_1a58 = std::unique_ptr<char,_std::default_delete<char>_>::get(&pvVar4->ptr);
        local_1a7c = p_4._4_4_ + 200000;
        pVar9 = std::make_pair<void*&,int>(&local_1a58,&local_1a7c);
        gtest_ar__12.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )pVar9.first;
        local_1a78.second = pVar9.second;
        local_1a78.first =
             (void *)gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        std::pair<const_void_*,_int>::pair<void_*,_int,_true>(&local_1a68,&local_1a78);
        std::
        set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
        ::erase((set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                 *)local_1a08,&local_1a68);
        res_p = AddressMap<std::pair<int,_unsigned_long>_>::Find
                          ((AddressMap<std::pair<int,_unsigned_long>_> *)&result,local_1a58);
        testing::AssertionResult::AssertionResult<std::pair<int,unsigned_long>const*>
                  ((AssertionResult *)local_1aa0,(pair<int,_unsigned_long> **)&res_p,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa0);
        if (!bVar2) {
          testing::Message::Message(&local_1aa8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_13.message_,(internal *)local_1aa0,
                     (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1ab0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                     ,0x97,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1ab0,&local_1aa8);
          testing::internal::AssertHelper::~AssertHelper(&local_1ab0);
          std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
          testing::Message::~Message(&local_1aa8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) goto LAB_0010de74;
        local_1ae4 = p_4._4_4_ + 200000;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1ae0,"result->first","i + 2*N",(int *)res_p,&local_1ae4);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ae0);
        if (!bVar2) {
          testing::Message::Message(&local_1af0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1ae0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                     ,0x98,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14.message_,&local_1af0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
          testing::Message::~Message(&local_1af0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ae0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) goto LAB_0010de74;
      }
      local_1b10 = std::
                   set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                   ::size((set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                           *)local_1a08);
      local_1b14 = 0;
      testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
                ((EqHelper *)local_1b08,"check_set.size()","0",&local_1b10,&local_1b14);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b08);
      if (!bVar2) {
        testing::Message::Message(&local_1b20);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1b08);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x9a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1b28,&local_1b20);
        testing::internal::AssertHelper::~AssertHelper(&local_1b28);
        testing::Message::~Message(&local_1b20);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b08);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
LAB_0010de74:
    std::
    set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
    ::~set((set<std::pair<const_void_*,_int>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
            *)local_1a08);
LAB_0010de80:
    AddressMap<std::pair<int,_unsigned_long>_>::~AddressMap
              ((AddressMap<std::pair<int,_unsigned_long>_> *)&result);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_0010dede;
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_0010dede:
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::~vector
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)local_13d0);
  return;
}

Assistant:

TEST(AddressMapUnittest, Basic) {
  constexpr int N = 100000;
  constexpr int kIters = 20;
  constexpr int kMaxRealSize = 49;
  // 100Mb to stress not finding previous object (AddressMap's cluster is 1Mb):
  constexpr size_t kMaxSize = 100 << 20;

  std::mt19937 rng(0);

  // generates uniformly distributed size_t in range [0, n)
  auto uniform = [&] (size_t n) -> size_t {
    return std::uniform_int_distribution<size_t>{0, n-1}(rng);
  };

  std::vector<PtrAndSize> ptrs_and_sizes;
  ptrs_and_sizes.reserve(N);
  for (int i = 0; i < N; ++i) {
    size_t s = uniform(kMaxRealSize-1) + 1;
    ptrs_and_sizes.emplace_back(new char[s], s);
  }

  for (int x = 0; x < kIters; ++x) {
    printf("Iteration %d/%d...\n", x, kIters);

    // Permute pointers to get rid of allocation order issues
    std::shuffle(ptrs_and_sizes.begin(), ptrs_and_sizes.end(), rng);

    AddressMap<ValueT> map(malloc, free);
    const ValueT* result;
    const void* res_p;

    // Insert a bunch of entries
    for (int i = 0; i < N; ++i) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_FALSE(map.Find(p));
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_FALSE(map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i);
      map.Insert(p, std::make_pair(i + N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
    }

    // Delete the even entries
    for (int i = 0; i < N; i += 2) {
      void* p = ptrs_and_sizes[i].ptr.get();
      ValueT removed;
      ASSERT_TRUE(map.FindAndRemove(p, &removed));
      ASSERT_EQ(removed.first, i + N);
    }

    // Lookup the odd entries and adjust them
    for (int i = 1; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + N);
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Insert even entries back
    for (int i = 0; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Check all entries
    std::set<std::pair<const void*, int> > check_set;
    map.Iterate([&] (const void* ptr, ValueT* val) {
      check_set.insert(std::make_pair(ptr, val->first));
    });
    ASSERT_EQ(check_set.size(), N);
    for (int i = 0; i < N; ++i) {
      void* p = ptrs_and_sizes[i].ptr.get();
      check_set.erase(std::make_pair(p, i + 2*N));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }
    ASSERT_EQ(check_set.size(), 0);
  }
}